

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

void FT_Done_GlyphSlot(FT_GlyphSlot slot)

{
  FT_Memory memory_00;
  FT_GlyphSlot local_30;
  FT_GlyphSlot cur;
  FT_GlyphSlot prev;
  FT_Memory memory;
  FT_Driver driver;
  FT_GlyphSlot slot_local;
  
  if (slot != (FT_GlyphSlot)0x0) {
    memory_00 = (slot->face->driver->root).memory;
    cur = (FT_GlyphSlot)0x0;
    for (local_30 = slot->face->glyph; local_30 != (FT_GlyphSlot)0x0; local_30 = local_30->next) {
      if (local_30 == slot) {
        if (cur == (FT_GlyphSlot)0x0) {
          slot->face->glyph = local_30->next;
        }
        else {
          cur->next = local_30->next;
        }
        if ((slot->generic).finalizer != (FT_Generic_Finalizer)0x0) {
          (*(slot->generic).finalizer)(slot);
        }
        ft_glyphslot_done(slot);
        ft_mem_free(memory_00,slot);
        return;
      }
      cur = local_30;
    }
  }
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_Done_GlyphSlot( FT_GlyphSlot  slot )
  {
    if ( slot )
    {
      FT_Driver     driver = slot->face->driver;
      FT_Memory     memory = driver->root.memory;
      FT_GlyphSlot  prev;
      FT_GlyphSlot  cur;


      /* Remove slot from its parent face's list */
      prev = NULL;
      cur  = slot->face->glyph;

      while ( cur )
      {
        if ( cur == slot )
        {
          if ( !prev )
            slot->face->glyph = cur->next;
          else
            prev->next = cur->next;

          /* finalize client-specific data */
          if ( slot->generic.finalizer )
            slot->generic.finalizer( slot );

          ft_glyphslot_done( slot );
          FT_FREE( slot );
          break;
        }
        prev = cur;
        cur  = cur->next;
      }
    }
  }